

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O0

int64_t google::protobuf::util::TimeUtil::TimestampToNanoseconds(Timestamp *timestamp)

{
  bool bVar1;
  int32_t iVar2;
  LogMessage *pLVar3;
  int64_t iVar4;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  Timestamp *local_10;
  Timestamp *timestamp_local;
  
  local_10 = timestamp;
  bVar1 = IsTimestampValid(timestamp);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    iVar4 = Timestamp::seconds(local_10);
    iVar2 = Timestamp::nanos(local_10);
    return iVar4 * 1000000000 + (long)iVar2;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"IsTimestampValid(timestamp)");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/time_util.cc"
             ,0x167,local_38._M_len,local_38._M_str);
  pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
  pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar3,(char (*) [40])"Timestamp is outside of the valid range");
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar3);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
}

Assistant:

int64_t TimeUtil::TimestampToNanoseconds(const Timestamp& timestamp) {
  ABSL_DCHECK(IsTimestampValid(timestamp))
      << "Timestamp is outside of the valid range";
  return timestamp.seconds() * kNanosPerSecond + timestamp.nanos();
}